

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall Assimp::IFC::Schema_2x3::IfcRelAggregates::IfcRelAggregates(IfcRelAggregates *this)

{
  *(undefined ***)&(this->super_IfcRelDecomposes).field_0xd8 = &PTR__Object_007331c0;
  *(undefined8 *)&this->field_0xe0 = 0;
  *(char **)&this->field_0xe8 = "IfcRelAggregates";
  IfcRelDecomposes::IfcRelDecomposes
            (&this->super_IfcRelDecomposes,&PTR_construction_vtable_24__007c6670);
  *(undefined8 *)&this->super_IfcRelDecomposes = 0x7c65b8;
  *(undefined8 *)&(this->super_IfcRelDecomposes).field_0xd8 = 0x7c6658;
  *(undefined8 *)&(this->super_IfcRelDecomposes).field_0x88 = 0x7c65e0;
  (this->super_IfcRelDecomposes).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRelDecomposes,_2UL>.
  _vptr_ObjectHelper = (_func_int **)0x7c6608;
  *(undefined8 *)&(this->super_IfcRelDecomposes).field_0xc8 = 0x7c6630;
  return;
}

Assistant:

IfcRelAggregates() : Object("IfcRelAggregates") {}